

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmem.c
# Opt level: O1

ngx_int_t ngx_shm_alloc(ngx_shm_t *shm)

{
  ngx_log_t *log;
  u_char *puVar1;
  int *piVar2;
  ngx_int_t nVar3;
  
  nVar3 = 0;
  puVar1 = (u_char *)mmap64((void *)0x0,shm->size,3,0x21,-1,0);
  shm->addr = puVar1;
  if (puVar1 == (u_char *)0xffffffffffffffff) {
    log = shm->log;
    nVar3 = -1;
    if (1 < log->log_level) {
      piVar2 = __errno_location();
      ngx_log_error_core(2,log,*piVar2,"mmap(MAP_ANON|MAP_SHARED, %uz) failed",shm->size);
    }
  }
  return nVar3;
}

Assistant:

ngx_int_t
ngx_shm_alloc(ngx_shm_t *shm)
{
    shm->addr = (u_char *) mmap(NULL, shm->size,
                                PROT_READ|PROT_WRITE,
                                MAP_ANON|MAP_SHARED, -1, 0);

    if (shm->addr == MAP_FAILED) {
        ngx_log_error(NGX_LOG_ALERT, shm->log, ngx_errno,
                      "mmap(MAP_ANON|MAP_SHARED, %uz) failed", shm->size);
        return NGX_ERROR;
    }

    return NGX_OK;
}